

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O1

string * re2c::output_get_state_abi_cxx11_(void)

{
  bool bVar1;
  opt_t *poVar2;
  string *in_RDI;
  
  poVar2 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
  bVar1 = poVar2->state_get_naked;
  realopt_t::operator->((realopt_t *)&DAT_0015d868);
  if (bVar1 == true) {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    std::__cxx11::string::_M_construct<char*>();
  }
  else {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    std::__cxx11::string::_M_construct<char*>();
    std::__cxx11::string::append((char *)in_RDI);
  }
  return in_RDI;
}

Assistant:

std::string output_get_state ()
{
	return opts->state_get_naked
		? opts->state_get
		: opts->state_get + "()";
}